

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O0

bool __thiscall
SubCircuit<4>::exploreSubtree
          (SubCircuit<4> *this,int thisNode,int startPrevSubtree,int endPrevSubtree,int *backfrom,
          int *backto,int *numback)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Lit LVar5;
  uint uVar6;
  Lit *pLVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *unaff_retaddr;
  iterator *in_stack_00000008;
  int varOutside;
  uint i_6;
  Clause *r_3;
  Lit evidenceInside;
  int i_5;
  vec<int> outside_1;
  vec<int> inside_1;
  uint i_4;
  uint i_3;
  vec<int> prevAndLater;
  Clause *r_2;
  Lit evidence;
  uint i_2;
  Clause *r_1;
  Clause *r;
  Lit evidenceOut;
  Lit evidenceIn;
  int i_1;
  vec<int> outside;
  vec<int> inside;
  iterator i;
  int child;
  bool isFirstChild;
  iterator *in_stack_fffffffffffffd18;
  int iVar8;
  undefined4 in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd24;
  vec<int> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  vec<int> *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  Clause *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd64;
  uint in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  Clause *in_stack_fffffffffffffd70;
  int reasonIndex;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  uint in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  SubCircuit<4> *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  uint local_214;
  Lit local_1d0;
  int local_1cc;
  vec<int> local_1c8;
  vec<int> local_1b8 [5];
  uint local_168;
  uint local_164;
  vec<int> local_160;
  Clause *local_150;
  int local_144;
  undefined1 local_140 [16];
  Lit local_130;
  uint local_12c;
  Clause *local_108;
  int local_fc;
  Clause *local_d8;
  uint local_cc;
  Lit local_b4 [6];
  Lit local_9c;
  int local_98;
  vec<int> local_88;
  vec<int> local_78 [4];
  undefined3 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffe0;
  
  iVar2 = *(int *)(in_RDI + 0xb0);
  *(int *)(in_RDI + 0xb0) = iVar2 + 1;
  *(int *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4) = iVar2;
  *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4);
  uVar6 = CONCAT13(1,in_stack_ffffffffffffffcc);
  IntView<4>::begin((IntView<4> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  do {
    IntView<4>::end((IntView<4> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    bVar1 = IntView<4>::iterator::operator!=
                      ((iterator *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd18);
    if (!bVar1) {
      if (*(int *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4) ==
          *(int *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4)) {
        vec<int>::vec(local_1b8);
        vec<int>::vec(&local_1c8);
        local_1cc = 0;
        while( true ) {
          reasonIndex = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
          iVar8 = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
          iVar2 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
          if (*(int *)(in_RDI + 0x14) <= local_1cc) break;
          if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4) <
              *(int *)(*(long *)(in_RDI + 0xa0) + (long)local_1cc * 4)) {
            vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                           ,(int *)in_stack_fffffffffffffd28);
          }
          else if (local_1cc != in_ESI) {
            vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                           ,(int *)in_stack_fffffffffffffd28);
          }
          local_1cc = local_1cc + 1;
        }
        vec<int>::vec<int>((vec<int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                           ,in_stack_fffffffffffffd38);
        LVar5 = getEvidenceLit(in_stack_fffffffffffffd88,
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        local_1d0 = LVar5;
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (int *)in_stack_fffffffffffffd28);
        bVar1 = Lit::operator!=(&local_1d0,::lit_True);
        if (bVar1) {
          if ((so.lazy & 1U) != 0) {
            in_stack_fffffffffffffd34 = vec<int>::size(local_1b8);
            vec<int>::size(&local_1c8);
            in_stack_fffffffffffffd28 = (vec<int> *)::Reason_new(in_stack_fffffffffffffd24);
            in_stack_fffffffffffffd38 = in_stack_fffffffffffffd28;
            pLVar7 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),iVar2);
            pLVar7->x = local_1d0.x;
            vec<int>::vec<int>((vec<int> *)CONCAT44(LVar5.x,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            vec<int>::vec<int>((vec<int> *)CONCAT44(LVar5.x,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            explainAcantreachB((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               reasonIndex,
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),iVar8,
                               in_stack_fffffffffffffd90);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
          }
          local_214 = 0;
          while (in_stack_fffffffffffffd24 = local_214, uVar6 = vec<int>::size(&local_1c8),
                in_stack_fffffffffffffd24 < uVar6) {
            vec<int>::operator[](&local_1c8,local_214);
            bVar1 = IntView<4>::setValNotR
                              ((IntView<4> *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (int64_t)in_stack_fffffffffffffd28);
            in_stack_fffffffffffffd20 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd20);
            if (bVar1) {
              addPropagation((SubCircuit<4> *)CONCAT44(LVar5.x,in_stack_fffffffffffffd40),
                             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
                             (int)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                             (Clause *)in_stack_fffffffffffffd28);
            }
            local_214 = local_214 + 1;
          }
        }
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      }
      return true;
    }
    iVar2 = IntView<4>::iterator::operator*
                      ((iterator *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4) == -1) {
      in_stack_fffffffffffffd18 = in_stack_00000008;
      bVar1 = exploreSubtree((SubCircuit<4> *)CONCAT44(in_ESI,in_EDX),in_ECX,
                             in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),in_R9,
                             (int *)CONCAT44(uVar6,iVar2),unaff_retaddr);
      if (!bVar1) {
        return false;
      }
      if (*(int *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 4) <
          *(int *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4)) {
        *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 4);
      }
      if ((((*(byte *)(in_RDI + 0x26) & 1) != 0) && ((uVar6 & 0x1000000) != 0)) &&
         (*(int *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 4) ==
          *(int *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4))) {
        vec<int>::vec(local_78);
        vec<int>::vec(&local_88);
        for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x14); local_98 = local_98 + 1) {
          if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_98 * 4) <
              *(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4)) {
            if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_98 * 4) !=
                *(int *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 4)) {
              vec<int>::push((vec<int> *)
                             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             (int *)in_stack_fffffffffffffd28);
            }
          }
          else {
            vec<int>::push((vec<int> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                           ,(int *)in_stack_fffffffffffffd28);
          }
        }
        vec<int>::vec<int>((vec<int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                           ,in_stack_fffffffffffffd38);
        local_9c = getEvidenceLit(in_stack_fffffffffffffd88,
                                  (vec<int> *)
                                  CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        vec<int>::vec<int>((vec<int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                           ,in_stack_fffffffffffffd38);
        local_b4[0] = getEvidenceLit(in_stack_fffffffffffffd88,
                                     (vec<int> *)
                                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        local_cc = ::lit_True.x;
        bVar1 = Lit::operator!=(local_b4,::lit_True);
        if (bVar1) {
          local_d8 = (Clause *)0x0;
          if ((so.lazy & 1U) != 0) {
            vec<int>::size(local_78);
            iVar2 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
            vec<int>::size(&local_88);
            local_d8 = ::Reason_new(in_stack_fffffffffffffd24);
            pLVar7 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),iVar2);
            pLVar7->x = local_b4[0].x;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            in_stack_fffffffffffffd18 = (iterator *)CONCAT44(iVar2,0xffffffff);
            explainAcantreachB((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               in_stack_fffffffffffffd90);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
          }
          addPropagation((SubCircuit<4> *)
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
                         (int)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                         (Clause *)in_stack_fffffffffffffd28);
        }
        local_fc = ::lit_True.x;
        bVar1 = Lit::operator!=(&local_9c,::lit_True);
        if (bVar1) {
          local_108 = (Clause *)0x0;
          if ((so.lazy & 1U) != 0) {
            vec<int>::size(local_78);
            iVar2 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
            vec<int>::size(&local_88);
            local_108 = ::Reason_new(in_stack_fffffffffffffd24);
            pLVar7 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),iVar2);
            pLVar7->x = local_9c.x;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            in_stack_fffffffffffffd18 = (iterator *)CONCAT44(iVar2,0xffffffff);
            explainAcantreachB((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               in_stack_fffffffffffffd90);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
          }
          for (local_12c = 0; uVar4 = local_12c, uVar3 = vec<int>::size(&local_88), uVar4 < uVar3;
              local_12c = local_12c + 1) {
            vec<int>::operator[](&local_88,local_12c);
            bVar1 = IntView<4>::indomain
                              ((IntView<4> *)
                               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                               (int64_t)in_stack_fffffffffffffd18);
            if (bVar1) {
              vec<int>::operator[](&local_88,local_12c);
              addPropagation((SubCircuit<4> *)
                             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
                             (int)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                             (Clause *)in_stack_fffffffffffffd28);
            }
          }
        }
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      }
      uVar6 = uVar6 & 0xffffff;
    }
    else if (iVar2 != in_ESI) {
      if ((in_EDX <= *(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4)) &&
         (*(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4) <= in_ECX)) {
        *(int *)&in_stack_00000008->view = *(int *)&in_stack_00000008->view + 1;
        *in_R8 = in_ESI;
        *in_R9 = iVar2;
      }
      if (((*(byte *)(in_RDI + 0x24) & 1) != 0) &&
         (*(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4) < in_EDX)) {
        in_stack_fffffffffffffd88 = (SubCircuit<4> *)local_140;
        vec<int>::vec<int>((vec<int> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                           ,in_stack_fffffffffffffd38);
        local_130 = getEvidenceLit(in_stack_fffffffffffffd88,
                                   (vec<int> *)
                                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        local_144 = ::lit_True.x;
        bVar1 = Lit::operator!=(&local_130,::lit_True);
        if (bVar1) {
          local_150 = (Clause *)0x0;
          if ((so.lazy & 1U) != 0) {
            vec<int>::vec(&local_160);
            in_stack_fffffffffffffd84 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
            vec<int>::size((vec<int> *)(in_RDI + 0x80));
            vec<int>::reserve((vec<int> *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              (uint)((ulong)in_stack_fffffffffffffd28 >> 0x20));
            local_164 = 0;
            while (in_stack_fffffffffffffd80 = local_164,
                  uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x60)),
                  in_stack_fffffffffffffd80 < uVar4) {
              vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),local_164);
              vec<int>::push((vec<int> *)
                             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             (int *)in_stack_fffffffffffffd28);
              local_164 = local_164 + 1;
            }
            local_168 = 0;
            while( true ) {
              in_stack_fffffffffffffd7c = local_168;
              uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80));
              iVar8 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
              if (uVar4 <= in_stack_fffffffffffffd7c) break;
              vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_168);
              vec<int>::push((vec<int> *)
                             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             (int *)in_stack_fffffffffffffd28);
              local_168 = local_168 + 1;
            }
            in_stack_fffffffffffffd64 = vec<int>::size((vec<int> *)(in_RDI + 0x70));
            uVar4 = vec<int>::size(&local_160);
            in_stack_fffffffffffffd6c = in_stack_fffffffffffffd64 * uVar4;
            in_stack_fffffffffffffd68 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
            vec<int>::size((vec<int> *)(in_RDI + 0x80));
            in_stack_fffffffffffffd70 = ::Reason_new(in_stack_fffffffffffffd24);
            local_150 = in_stack_fffffffffffffd70;
            pLVar7 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),iVar8);
            pLVar7->x = local_130.x;
            in_stack_fffffffffffffd58 = local_150;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            explainAcantreachB((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               in_stack_fffffffffffffd90);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::size((vec<int> *)(in_RDI + 0x60));
            vec<int>::size((vec<int> *)(in_RDI + 0x80));
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               in_stack_fffffffffffffd38);
            in_stack_fffffffffffffd18 = (iterator *)CONCAT44(iVar8,0xffffffff);
            explainAcantreachB((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                               in_stack_fffffffffffffd90);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          );
          }
          addPropagation((SubCircuit<4> *)
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
                         (int)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                         (Clause *)in_stack_fffffffffffffd28);
        }
      }
      if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4) <
          *(int *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4)) {
        *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0xa0) + (long)iVar2 * 4);
      }
    }
    IntView<4>::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  } while( true );
}

Assistant:

bool exploreSubtree(int thisNode, int startPrevSubtree, int endPrevSubtree, int* backfrom,
											int* backto, int* numback) {
		// fprintf(stderr,"exploring subtree\n");
		index[thisNode] = nodesSeen++;
		lowlink[thisNode] = index[thisNode];
		bool isFirstChild = true;
		int child;
		for (typename IntView<U>::iterator i = x[thisNode].begin(); i != x[thisNode].end(); ++i) {
			child = *i;
			// If we haven't visited the child yet, do so now
			if (index[child] == -1) {
				// fprintf(stderr,"new child %d\n", child);
				if (!exploreSubtree(child, startPrevSubtree, endPrevSubtree, backfrom, backto, numback)) {
					return false;  // fail if there was an scc contained within this child
				}

				if (lowlink[child] < lowlink[thisNode]) {
					lowlink[thisNode] = lowlink[child];
				}

				// If this is the first child and its lowlink is equal to the
				// parent's index, we can prune the edge from this node to the
				// child (as the circuit must come back up through an edge from
				// the child to this node and therefore can't go in the other
				// direction). We can do this as long as there is a node outside
				// the child and this node which has to be in.
				// We can also prune any edges from a node outside the child's
				// subtree to this node, as long as something inside the child has to be in.
				if (pruneWithin && isFirstChild && lowlink[child] == index[thisNode]) {
					// XXX [AS] Commented following line, because propagator related statistics
					// should be collected within the propagator class.
					// engine.prunedGeneralise++;
					// The reason is that no node in the child's subtree reaches a node outside the subtree
					// that isn't the parent, and at least one node in the child's subtree is in the circuit
					// First divide the nodes into those inside and outside the child's subtree
					vec<int> inside;
					vec<int> outside;
					for (int i = 0; i < size; i++) {
						if (index[i] >= index[child]) {
							inside.push(i);
						} else if (index[i] != index[thisNode]) {
							outside.push(i);
						}
					}

					// Now check one node is definitely in
					const Lit evidenceIn = getEvidenceLit(inside);
					const Lit evidenceOut = getEvidenceLit(outside);
					if (evidenceOut != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceOut;
							explainAcantreachB(r, 2, inside, outside);
						}
						addPropagation(false, thisNode, child, r);
					}
					if (evidenceIn != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceIn;
							explainAcantreachB(r, 2, inside, outside);
						}
						for (unsigned int i = 0; i < outside.size(); i++) {
							if (x[outside[i]].indomain(thisNode)) {
								addPropagation(false, outside[i], thisNode, r);
							}
						}
					}
				}

				isFirstChild = false;        // We've now visited at least one child
			} else if (child != thisNode)  // This is a node we've seen before (ignore self-cycle edges)
			{
				// fprintf(stderr,"old child %d\n", child);
				//  If child is within the last subtree we've found a backedge (from this node to the child)
				if (index[child] >= startPrevSubtree && index[child] <= endPrevSubtree) {
					(*numback)++;
					*backfrom = thisNode;
					*backto = child;
				}

				// If w is from a subtree before the previous one prune this edge (if that option is set)
				if (pruneSkip && index[child] < startPrevSubtree) {
					const Lit evidence = getEvidenceLit(prev);
					if (evidence != lit_True) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.prunedSkip++;
						Clause* r = nullptr;
						if (so.lazy) {
							// The reason is that no node in an earlier
							// subtree can reach the prev or later subtrees,
							// and no node in the prev subtree can reach
							// later subtrees.
							vec<int> prevAndLater;
							prevAndLater.reserve(prev.size() + later.size());
							for (unsigned int i = 0; i < prev.size(); i++) {
								prevAndLater.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prevAndLater.push(later[i]);
							}
							r = Reason_new(earlier.size() * prevAndLater.size() + prev.size() * later.size() + 2);
							(*r)[1] = evidence;
							explainAcantreachB(r, 2, prev, later);
							explainAcantreachB(r, prev.size() * later.size() + 2, earlier, prevAndLater);
						}
						addPropagation(false, thisNode, child, r);
					}
				}

				if (index[child] < lowlink[thisNode]) {
					lowlink[thisNode] = index[child];
				}
			}
			// fprintf(stderr,"lowpoint is %d\n", lowlink[thisNode]);
		}

		// Fail if there's an scc rooted here
		if (lowlink[thisNode] == index[thisNode]) {
			// The reason is that no node in the subtree rooted by this
			// one (including this one)
			// reaches a node outside that subtree, and some node inside
			// the subtree (not including this node) is required in the circuit.
			// Start by finding the nodes inside and outside the subtree.
			vec<int> inside;
			vec<int> outside;

			for (int i = 0; i < size; i++) {
				if (index[i] > index[thisNode]) {
					inside.push(i);
				} else if (i != thisNode) {
					outside.push(i);
				}
			}

			const Lit evidenceInside = getEvidenceLit(inside);  // at this point inside excludes this node

			inside.push(thisNode);  // now include this node

			// Set all vars outside the component to be self-cycles
			if (evidenceInside != lit_True) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(inside.size() * outside.size() + 2);
					(*r)[1] = evidenceInside;

					explainAcantreachB(r, 2, inside, outside);
				}
				for (unsigned int i = 0; i < outside.size(); i++) {
					const int varOutside = outside[i];
					if (x[varOutside].setValNotR(varOutside)) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.multipleSCC++;
						addPropagation(true, varOutside, varOutside, r);
						/* if(!x[varOutside].setVal(varOutside, r))
						 {
						 fprintf(stderr, "failing\n");
								 return false;
						 }*/
					}
				}
			}
		}

		return true;
	}